

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ImageInverter *__p;
  _Rb_tree_header *p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  undefined8 extraout_RAX;
  long *plVar8;
  ostream *poVar9;
  char *pcVar10;
  int extraout_EDX;
  undefined4 uVar11;
  undefined8 unaff_RBP;
  bool bVar12;
  QPDF qpdf;
  QPDFObjectHandle bits_per_component;
  QPDFWriter w;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  QPDFObjectHandle color_space;
  QPDFObjectHandle image_dict;
  QPDF local_130 [8];
  long *local_128 [2];
  long local_118 [2];
  undefined4 local_104;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_100;
  QPDFObjectHandle local_f0;
  string local_e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined1 local_d0 [8];
  _Rb_tree_node_base local_c8;
  ImageInverter *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  char *local_90;
  char *local_88;
  long local_80;
  long local_78;
  ImageInverter *local_70;
  long local_68;
  long local_60;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc < 2) || (iVar3 = strcmp(argv[1]," --static-id"), iVar3 != 0)) {
    uVar11 = 0;
  }
  else {
    argv = argv + 1;
    argc = argc + -1;
    uVar11 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  if (argc - 3U < 2) {
    pcVar10 = argv[1];
    pcVar1 = argv[2];
    local_90 = pcVar10;
    QPDF::QPDF(local_130);
    QPDF::processFile((char *)local_130,pcVar10);
    __p = (ImageInverter *)operator_new(0x40);
    QPDFObjectHandle::StreamDataProvider::StreamDataProvider((StreamDataProvider *)__p,false);
    *(undefined ***)__p = &PTR__ImageInverter_00106c90;
    p_Var4 = &(__p->copied_images)._M_t._M_impl.super__Rb_tree_header;
    (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0 = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ImageInverter*>(&local_98,__p);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_d0,local_130);
    local_104 = uVar11;
    local_88 = pcVar1;
    local_70 = __p;
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_d0);
    local_80 = local_60;
    if (local_68 != local_60) {
      do {
        local_78 = local_68;
        QPDFPageObjectHelper::getImages_abi_cxx11_();
        for (p_Var6 = local_c8._M_left; p_Var6 != &local_c8;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          QPDFObjectHandle::getDict();
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/ColorSpace","");
          QPDFObjectHandle::getKey(local_50);
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"/BitsPerComponent","");
          QPDFObjectHandle::getKey(local_e0);
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          cVar2 = QPDFObjectHandle::pipeStreamData
                            ((Pipeline *)(p_Var6 + 2),0,qpdf_dl_generalized,true,false);
          if (cVar2 != '\0') {
            local_128[0] = local_118;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/DeviceGray","");
            cVar2 = QPDFObjectHandle::isNameAndEquals(local_50);
            if ((cVar2 == '\0') || (cVar2 = QPDFObjectHandle::isInteger(), cVar2 == '\0')) {
              bVar12 = false;
            }
            else {
              lVar5 = QPDFObjectHandle::getIntValue();
              bVar12 = lVar5 == 8;
            }
            if (local_128[0] != local_118) {
              operator_delete(local_128[0],local_118[0] + 1);
            }
            if (bVar12) {
              local_f0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)(p_Var6 + 2);
              local_f0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[2]._M_parent;
              if ((_Base_ptr)
                  local_f0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&((_Base_ptr)
                           local_f0.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_parent =
                       *(int *)&((_Base_ptr)
                                local_f0.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&((_Base_ptr)
                           local_f0.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_parent =
                       *(int *)&((_Base_ptr)
                                local_f0.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_parent + 1;
                }
              }
              local_100.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = &local_a0->super_StreamDataProvider;
              local_100.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = local_98._M_pi;
              if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
                }
              }
              ImageInverter::registerImage(local_70,&local_f0,&local_100);
              if (local_100.
                  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_100.
                           super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if ((_Base_ptr)
                  local_f0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_f0.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
          }
          if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
          }
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     *)local_d0);
        local_68 = local_78 + 0x38;
      } while (local_68 != local_80);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_68);
    pcVar10 = local_88;
    QPDFWriter::QPDFWriter((QPDFWriter *)local_d0,local_130,local_88);
    if ((char)local_104 != '\0') {
      QPDFWriter::setStaticID(SUB81(local_d0,0));
    }
    QPDFWriter::write();
    pcVar1 = whoami;
    if (whoami == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108080);
    }
    else {
      sVar7 = strlen(whoami);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": new file written to ",0x16);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108080);
    }
    else {
      sVar7 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
    }
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
    QPDF::~QPDF(local_130);
    return 0;
  }
  usage();
  if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
  }
  QPDF::~QPDF(local_130);
  if (extraout_EDX == 1) {
    plVar8 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar9 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," processing file ",0x11);
    poVar9 = std::operator<<(poVar9,local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    pcVar10 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        auto* inv = new ImageInverter;
        auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(inv);

        // For each page...
        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all images on the page.
            for (auto& iter: page.getImages()) {
                QPDFObjectHandle& image = iter.second;
                QPDFObjectHandle image_dict = image.getDict();
                QPDFObjectHandle color_space = image_dict.getKey("/ColorSpace");
                QPDFObjectHandle bits_per_component = image_dict.getKey("/BitsPerComponent");

                // For our example, we can only work with 8-bit grayscale images that we can fully
                // decode.  Use pipeStreamData with a null pipeline to determine whether the image
                // is filterable.  Directly inspect keys to determine the image type.
                if (image.pipeStreamData(nullptr, qpdf_ef_compress, qpdf_dl_all) &&
                    color_space.isNameAndEquals("/DeviceGray") && bits_per_component.isInteger() &&
                    (bits_per_component.getIntValue() == 8)) {
                    inv->registerImage(image, p);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}